

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_to_base64(wally_psbt *psbt,uint32_t flags,char **output)

{
  int local_44;
  size_t sStack_40;
  int ret;
  size_t written;
  size_t len;
  uchar *buff;
  char **output_local;
  wally_psbt *pwStack_18;
  uint32_t flags_local;
  wally_psbt *psbt_local;
  
  if (output == (char **)0x0) {
    psbt_local._4_4_ = -2;
  }
  else {
    *output = (char *)0x0;
    if (psbt == (wally_psbt *)0x0) {
      psbt_local._4_4_ = -2;
    }
    else {
      buff = (uchar *)output;
      output_local._4_4_ = flags;
      pwStack_18 = psbt;
      psbt_local._4_4_ = wally_psbt_get_length(psbt,flags,&written);
      if (psbt_local._4_4_ == 0) {
        len = (size_t)wally_malloc(written);
        if ((uchar *)len == (uchar *)0x0) {
          psbt_local._4_4_ = -3;
        }
        else {
          local_44 = wally_psbt_to_bytes(pwStack_18,output_local._4_4_,(uchar *)len,written,
                                         &stack0xffffffffffffffc0);
          if (local_44 == 0) {
            if (sStack_40 == written) {
              local_44 = wally_base64_from_bytes((uchar *)len,written,0,(char **)buff);
            }
            else {
              local_44 = -1;
            }
          }
          clear_and_free((void *)len,written);
          psbt_local._4_4_ = local_44;
        }
      }
    }
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_to_base64(const struct wally_psbt *psbt, uint32_t flags, char **output)
{
    unsigned char *buff;
    size_t len, written;
    int ret = WALLY_OK;

    TX_CHECK_OUTPUT;
    if (!psbt)
        return WALLY_EINVAL;

    if ((ret = wally_psbt_get_length(psbt, flags, &len)) != WALLY_OK)
        return ret;

    if ((buff = wally_malloc(len)) == NULL)
        return WALLY_ENOMEM;

    /* Get psbt bytes */
    if ((ret = wally_psbt_to_bytes(psbt, flags, buff, len, &written)) != WALLY_OK)
        goto done;

    if (written != len) {
        ret = WALLY_ERROR; /* Length calculated incorrectly */
        goto done;
    }

    /* Base64 encode */
    ret = wally_base64_from_bytes(buff, len, 0, output);

done:
    clear_and_free(buff, len);
    return ret;
}